

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert
          (CopyPropagateArrays *this,Instruction *insert_inst)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *this_00;
  TypeManager *this_01;
  Type *type;
  Instruction *this_02;
  Instruction *in_RDX;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  memory_object;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  current_memory_object;
  AccessChainEntry current_last_access;
  AccessChainEntry last_access;
  
  if (in_RDX->opcode_ != OpCompositeInsert) {
    __assert_fail("insert_inst->opcode() == spv::Op::OpCompositeInsert && \"Expecting an OpCompositeInsert instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x194,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction *)"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(*(IRContext **)&insert_inst->opcode_);
  this_01 = IRContext::get_type_mgr(*(IRContext **)&insert_inst->opcode_);
  uVar3 = Instruction::type_id(in_RDX);
  type = analysis::TypeManager::GetType(this_01,uVar3);
  uVar3 = anon_unknown_0::GetNumberOfMembers(type,*(IRContext **)&insert_inst->opcode_);
  if (((uVar3 == 0) || (uVar4 = Instruction::NumInOperands(in_RDX), uVar4 != 3)) ||
     (uVar4 = Instruction::GetSingleWordInOperand(in_RDX,2), uVar4 != uVar3 - 1)) {
    (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
    return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )this;
  }
  Instruction::GetSingleWordInOperand(in_RDX,0);
  GetSourceObjectIfAny((CopyPropagateArrays *)&memory_object,(uint32_t)insert_inst);
  if (((__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        )memory_object._M_t.
         super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
         .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
         _M_head_impl !=
       (__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        )0x0) &&
     (*(long *)((long)memory_object._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      .
                      super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                      ._M_head_impl + 8) !=
      *(long *)((long)memory_object._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      .
                      super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                      ._M_head_impl + 0x10))) {
    last_access = *(AccessChainEntry *)
                   (*(long *)((long)memory_object._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                    .
                                    super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                    ._M_head_impl + 0x10) + -8);
    bVar2 = IsAccessChainIndexValidAndEqualTo((CopyPropagateArrays *)insert_inst,&last_access,uVar4)
    ;
    if (bVar2) {
      MemoryObject::PopIndirection
                ((MemoryObject *)
                 memory_object._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                 _M_head_impl);
      uVar3 = Instruction::GetSingleWordInOperand(in_RDX,1);
      this_02 = analysis::DefUseManager::GetDef(this_00,uVar3);
      do {
        if (uVar4 == 0) {
          (this->super_MemPass).super_Pass._vptr_Pass =
               (_func_int **)
               memory_object._M_t.
               super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
               _M_head_impl;
          memory_object._M_t.
          super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
          _M_head_impl = (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
                          )(__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                            )0x0;
          break;
        }
        if (((this_02->opcode_ != OpCompositeInsert) ||
            (uVar3 = Instruction::NumInOperands(this_02), uVar3 != 3)) ||
           (uVar3 = Instruction::GetSingleWordInOperand(this_02,2), uVar3 != uVar4 - 1))
        goto LAB_004d0416;
        Instruction::GetSingleWordInOperand(this_02,0);
        GetSourceObjectIfAny((CopyPropagateArrays *)&current_memory_object,(uint32_t)insert_inst);
        if ((__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
             )current_memory_object._M_t.
              super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
              .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
              _M_head_impl ==
            (__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
             )0x0) {
LAB_004d03de:
          (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
          bVar2 = false;
        }
        else {
          lVar1 = *(long *)((long)current_memory_object._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                  .
                                  super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                  ._M_head_impl + 0x10);
          if (((*(long *)((long)current_memory_object._M_t.
                                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                ._M_head_impl + 8) == lVar1) ||
              ((*(long *)((long)memory_object._M_t.
                                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                ._M_head_impl + 0x10) -
                *(long *)((long)memory_object._M_t.
                                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                ._M_head_impl + 8) >> 3) + 1 !=
               lVar1 - *(long *)((long)current_memory_object._M_t.
                                       super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                       .
                                       super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                       ._M_head_impl + 8) >> 3)) ||
             (bVar2 = MemoryObject::Contains
                                ((MemoryObject *)
                                 memory_object._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                 ._M_head_impl,
                                 (MemoryObject *)
                                 current_memory_object._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                 ._M_head_impl), !bVar2)) goto LAB_004d03de;
          current_last_access = *(AccessChainEntry *)(lVar1 + -8);
          bVar2 = IsAccessChainIndexValidAndEqualTo
                            ((CopyPropagateArrays *)insert_inst,&current_last_access,uVar3);
          if (bVar2) {
            uVar4 = Instruction::GetSingleWordInOperand(this_02,1);
            this_02 = analysis::DefUseManager::GetDef(this_00,uVar4);
          }
          else {
            (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
          }
        }
        std::
        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        ::~unique_ptr(&current_memory_object);
        uVar4 = uVar3;
      } while (bVar2 != false);
      goto LAB_004d041a;
    }
  }
LAB_004d0416:
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
LAB_004d041a:
  std::
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  ::~unique_ptr(&memory_object);
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction* insert_inst) {
  assert(insert_inst->opcode() == spv::Op::OpCompositeInsert &&
         "Expecting an OpCompositeInsert instruction.");

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* result_type = type_mgr->GetType(insert_inst->type_id());

  uint32_t number_of_elements = GetNumberOfMembers(result_type, context());

  if (number_of_elements == 0) {
    return nullptr;
  }

  if (insert_inst->NumInOperands() != 3) {
    return nullptr;
  }

  if (insert_inst->GetSingleWordInOperand(2) != number_of_elements - 1) {
    return nullptr;
  }

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(insert_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, number_of_elements - 1)) {
    return nullptr;
  }

  memory_object->PopIndirection();

  Instruction* current_insert =
      def_use_mgr->GetDef(insert_inst->GetSingleWordInOperand(1));
  for (uint32_t i = number_of_elements - 1; i > 0; --i) {
    if (current_insert->opcode() != spv::Op::OpCompositeInsert) {
      return nullptr;
    }

    if (current_insert->NumInOperands() != 3) {
      return nullptr;
    }

    if (current_insert->GetSingleWordInOperand(2) != i - 1) {
      return nullptr;
    }

    std::unique_ptr<MemoryObject> current_memory_object =
        GetSourceObjectIfAny(current_insert->GetSingleWordInOperand(0));

    if (!current_memory_object) {
      return nullptr;
    }

    if (!current_memory_object->IsMember()) {
      return nullptr;
    }

    if (memory_object->AccessChain().size() + 1 !=
        current_memory_object->AccessChain().size()) {
      return nullptr;
    }

    if (!memory_object->Contains(current_memory_object.get())) {
      return nullptr;
    }

    AccessChainEntry current_last_access =
        current_memory_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(current_last_access, i - 1)) {
      return nullptr;
    }
    current_insert =
        def_use_mgr->GetDef(current_insert->GetSingleWordInOperand(1));
  }

  return memory_object;
}